

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

void printhex32(void *blob,int len)

{
  long lVar1;
  
  printf("{ ");
  for (lVar1 = 0; lVar1 < len / 4; lVar1 = lVar1 + 1) {
    printf("0x%08x, ",(ulong)*(uint *)((long)blob + lVar1 * 4));
  }
  putchar(0x7d);
  return;
}

Assistant:

void printhex32 ( const void * blob, int len )
{
  assert((len & 3) == 0);

  uint32_t * d = (uint32_t*)blob;

  printf("{ ");

  for(int i = 0; i < len/4; i++)
  {
    printf("0x%08x, ",d[i]);
  }

  printf("}");
}